

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  AssertionResultData *data_local;
  AssertionInfo *info_local;
  AssertionResult *this_local;
  
  memcpy(this,info,0x38);
  AssertionResultData::AssertionResultData(&this->m_resultData,data);
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData const& data )
    :   m_info( info ),
        m_resultData( data )
    {}